

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O1

void htmlNodeDumpFormatOutput
               (xmlOutputBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur,char *encoding,int format)

{
  xmlElementType xVar1;
  int iVar2;
  _xmlNode *p_Var3;
  htmlElemDesc *phVar4;
  uint *encoding_00;
  _xmlNode *cur_00;
  char *str;
  xmlChar *pxVar5;
  _xmlAttr *cur_01;
  
  xmlInitParser();
  p_Var3 = cur;
  if (buf == (xmlOutputBufferPtr)0x0 || cur == (xmlNodePtr)0x0) {
    return;
  }
LAB_00152a7e:
  do {
    cur_00 = p_Var3;
    encoding_00 = &switchD_00152a9d::switchdataD_001f9ce4;
    switch(cur_00->type) {
    case XML_ELEMENT_NODE:
      if (cur_00->ns == (xmlNs *)0x0) {
        phVar4 = htmlTagLookup(cur_00->name);
      }
      else {
        phVar4 = (htmlElemDesc *)0x0;
      }
      xmlOutputBufferWriteString(buf,"<");
      if ((cur_00->ns != (xmlNs *)0x0) && (pxVar5 = cur_00->ns->prefix, pxVar5 != (xmlChar *)0x0)) {
        xmlOutputBufferWriteString(buf,(char *)pxVar5);
        xmlOutputBufferWriteString(buf,":");
      }
      xmlOutputBufferWriteString(buf,(char *)cur_00->name);
      if (cur_00->nsDef != (xmlNsPtr)0x0) {
        xmlNsListDumpOutput(buf,cur_00->nsDef);
      }
      for (cur_01 = cur_00->properties; cur_01 != (xmlAttrPtr)0x0; cur_01 = cur_01->next) {
        htmlAttrDumpOutput(buf,doc,cur_01,(char *)encoding_00);
      }
      if ((phVar4 == (htmlElemDesc *)0x0) || (phVar4->empty == '\0')) {
        if (cur_00->children != (_xmlNode *)0x0) {
          xmlOutputBufferWriteString(buf,">");
          if (((format != 0) && (phVar4 != (htmlElemDesc *)0x0)) && (phVar4->isinline == '\0')) {
            xVar1 = cur_00->children->type;
            if (((xVar1 != XML_TEXT_NODE) && (xVar1 != XML_ENTITY_REF_NODE)) &&
               ((cur_00->children != cur_00->last &&
                ((cur_00->name != (xmlChar *)0x0 && (*cur_00->name != 'p')))))) {
              xmlOutputBufferWriteString(buf,"\n");
            }
          }
          p_Var3 = cur_00->children;
          break;
        }
        if ((((phVar4 == (htmlElemDesc *)0x0) || (phVar4->saveEndTag == '\0')) ||
            (iVar2 = xmlStrcmp((xmlChar *)phVar4->name,"html"), iVar2 == 0)) ||
           (iVar2 = xmlStrcmp((xmlChar *)phVar4->name,"body"), iVar2 == 0)) {
          xmlOutputBufferWriteString(buf,"></");
          if ((cur_00->ns != (xmlNs *)0x0) &&
             (pxVar5 = cur_00->ns->prefix, pxVar5 != (xmlChar *)0x0)) {
            xmlOutputBufferWriteString(buf,(char *)pxVar5);
            xmlOutputBufferWriteString(buf,":");
          }
          xmlOutputBufferWriteString(buf,(char *)cur_00->name);
        }
      }
      xmlOutputBufferWriteString(buf,">");
      if (format == 0) goto switchD_00152a9d_caseD_6;
      p_Var3 = cur_00->next;
      if (p_Var3 == (_xmlNode *)0x0 || phVar4 == (htmlElemDesc *)0x0) goto switchD_00152a9d_caseD_6;
      if (phVar4->isinline != '\0') goto switchD_00152a9d_caseD_6;
LAB_00152e79:
      if (p_Var3->type == XML_TEXT_NODE) goto switchD_00152a9d_caseD_6;
      if (p_Var3->type == XML_ENTITY_REF_NODE) goto switchD_00152a9d_caseD_6;
      if (cur_00->parent == (_xmlNode *)0x0) goto switchD_00152a9d_caseD_6;
      pxVar5 = cur_00->parent->name;
      if (pxVar5 == (xmlChar *)0x0) goto switchD_00152a9d_caseD_6;
      if (*pxVar5 == 'p') goto switchD_00152a9d_caseD_6;
      do {
        pxVar5 = "\n";
LAB_00152ea7:
        xmlOutputBufferWriteString(buf,(char *)pxVar5);
switchD_00152a9d_caseD_6:
        while( true ) {
          if (cur_00 == cur) {
            return;
          }
          p_Var3 = cur_00->next;
          if (cur_00->next != (_xmlNode *)0x0) goto LAB_00152a7e;
          cur_00 = cur_00->parent;
          if (cur_00 == (_xmlNode *)0x0) {
            return;
          }
          if ((cur_00->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE) break;
          if ((format == 0) || (cur_00->ns != (xmlNs *)0x0)) {
            phVar4 = (htmlElemDesc *)0x0;
          }
          else {
            phVar4 = htmlTagLookup(cur_00->name);
          }
          if ((phVar4 != (htmlElemDesc *)0x0 && format != 0) && (phVar4->isinline == '\0')) {
            xVar1 = cur_00->last->type;
            if (((xVar1 != XML_TEXT_NODE) &&
                (((xVar1 != XML_ENTITY_REF_NODE && (cur_00->children != cur_00->last)) &&
                 (cur_00->name != (xmlChar *)0x0)))) && (*cur_00->name != 'p')) {
              xmlOutputBufferWriteString(buf,"\n");
            }
          }
          xmlOutputBufferWriteString(buf,"</");
          if ((cur_00->ns != (xmlNs *)0x0) &&
             (pxVar5 = cur_00->ns->prefix, pxVar5 != (xmlChar *)0x0)) {
            xmlOutputBufferWriteString(buf,(char *)pxVar5);
            xmlOutputBufferWriteString(buf,":");
          }
          xmlOutputBufferWriteString(buf,(char *)cur_00->name);
          xmlOutputBufferWriteString(buf,">");
          if (((phVar4 != (htmlElemDesc *)0x0 && format != 0) && (phVar4->isinline == '\0')) &&
             (p_Var3 = cur_00->next, p_Var3 != (_xmlNode *)0x0)) goto LAB_00152e79;
        }
      } while( true );
    case XML_ATTRIBUTE_NODE:
      htmlAttrDumpOutput(buf,doc,(xmlAttrPtr)cur_00,(char *)&switchD_00152a9d::switchdataD_001f9ce4)
      ;
      goto switchD_00152a9d_caseD_6;
    case XML_TEXT_NODE:
      if (cur_00->content == (xmlChar *)0x0) goto switchD_00152a9d_caseD_6;
      if ((cur_00->name != "textnoenc") &&
         ((cur_00->parent == (_xmlNode *)0x0 ||
          ((iVar2 = xmlStrcasecmp(cur_00->parent->name,"script"), iVar2 != 0 &&
           (iVar2 = xmlStrcasecmp(cur_00->parent->name,"style"), iVar2 != 0)))))) {
        pxVar5 = xmlEncodeEntitiesReentrant(doc,cur_00->content);
        if (pxVar5 == (xmlChar *)0x0) goto switchD_00152a9d_caseD_6;
        xmlOutputBufferWriteString(buf,(char *)pxVar5);
        (*xmlFree)(pxVar5);
        goto switchD_00152a9d_caseD_6;
      }
      pxVar5 = cur_00->content;
      goto LAB_00152ea7;
    case XML_CDATA_SECTION_NODE:
      pxVar5 = cur_00->content;
      if (pxVar5 == (xmlChar *)0x0) goto switchD_00152a9d_caseD_6;
      goto LAB_00152ea7;
    case XML_ENTITY_REF_NODE:
      xmlOutputBufferWriteString(buf,"&");
      xmlOutputBufferWriteString(buf,(char *)cur_00->name);
      pxVar5 = ";";
      goto LAB_00152ea7;
    default:
      goto switchD_00152a9d_caseD_6;
    case XML_PI_NODE:
      if (cur_00->name == (xmlChar *)0x0) goto switchD_00152a9d_caseD_6;
      xmlOutputBufferWriteString(buf,"<?");
      xmlOutputBufferWriteString(buf,(char *)cur_00->name);
      if (cur_00->content != (xmlChar *)0x0) {
        xmlOutputBufferWriteString(buf," ");
        xmlOutputBufferWriteString(buf,(char *)cur_00->content);
      }
      pxVar5 = ">";
      goto LAB_00152ea7;
    case XML_COMMENT_NODE:
      if (cur_00->content == (xmlChar *)0x0) goto switchD_00152a9d_caseD_6;
      xmlOutputBufferWriteString(buf,"<!--");
      xmlOutputBufferWriteString(buf,(char *)cur_00->content);
      pxVar5 = "-->";
      goto LAB_00152ea7;
    case XML_DOCUMENT_NODE:
    case XML_HTML_DOCUMENT_NODE:
      pxVar5 = cur_00->content;
      if (pxVar5 != (xmlChar *)0x0) {
        xmlOutputBufferWriteString(buf,"<!DOCTYPE ");
        xmlOutputBufferWriteString(buf,*(char **)(pxVar5 + 0x10));
        if (*(long *)(pxVar5 + 0x68) == 0) {
          if ((*(xmlChar **)(pxVar5 + 0x70) != (xmlChar *)0x0) &&
             (iVar2 = xmlStrcmp(*(xmlChar **)(pxVar5 + 0x70),(xmlChar *)"about:legacy-compat"),
             iVar2 != 0)) {
            str = " SYSTEM ";
            goto LAB_00152c58;
          }
        }
        else {
          xmlOutputBufferWriteString(buf," PUBLIC ");
          xmlBufWriteQuotedString(buf->buffer,*(xmlChar **)(pxVar5 + 0x68));
          if (*(long *)(pxVar5 + 0x70) != 0) {
            str = " ";
LAB_00152c58:
            xmlOutputBufferWriteString(buf,str);
            xmlBufWriteQuotedString(buf->buffer,*(xmlChar **)(pxVar5 + 0x70));
          }
        }
        xmlOutputBufferWriteString(buf,">\n");
      }
      p_Var3 = cur_00->children;
      if (cur_00->children == (_xmlNode *)0x0) goto switchD_00152a9d_caseD_6;
    }
  } while( true );
}

Assistant:

void
htmlNodeDumpFormatOutput(xmlOutputBufferPtr buf, xmlDocPtr doc,
	                 xmlNodePtr cur, const char *encoding, int format) {
    xmlNodePtr root;
    xmlAttrPtr attr;
    const htmlElemDesc * info;

    xmlInitParser();

    if ((cur == NULL) || (buf == NULL)) {
	return;
    }

    root = cur;
    while (1) {
        switch (cur->type) {
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_NODE:
            if (((xmlDocPtr) cur)->intSubset != NULL) {
                htmlDtdDumpOutput(buf, (xmlDocPtr) cur, NULL);
            }
            if (cur->children != NULL) {
                cur = cur->children;
                continue;
            }
            break;

        case XML_ELEMENT_NODE:
            /*
             * Get specific HTML info for that node.
             */
            if (cur->ns == NULL)
                info = htmlTagLookup(cur->name);
            else
                info = NULL;

            xmlOutputBufferWriteString(buf, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWriteString(buf, ":");
            }
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutput(buf, cur->nsDef);
            attr = cur->properties;
            while (attr != NULL) {
                htmlAttrDumpOutput(buf, doc, attr, encoding);
                attr = attr->next;
            }

            if ((info != NULL) && (info->empty)) {
                xmlOutputBufferWriteString(buf, ">");
            } else if (cur->children == NULL) {
                if ((info != NULL) && (info->saveEndTag != 0) &&
                    (xmlStrcmp(BAD_CAST info->name, BAD_CAST "html")) &&
                    (xmlStrcmp(BAD_CAST info->name, BAD_CAST "body"))) {
                    xmlOutputBufferWriteString(buf, ">");
                } else {
                    xmlOutputBufferWriteString(buf, "></");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWriteString(buf, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    xmlOutputBufferWriteString(buf, ">");
                }
            } else {
                xmlOutputBufferWriteString(buf, ">");
                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->children->type != HTML_TEXT_NODE) &&
                    (cur->children->type != HTML_ENTITY_REF_NODE) &&
                    (cur->children != cur->last) &&
                    (cur->name != NULL) &&
                    (cur->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");
                cur = cur->children;
                continue;
            }

            if ((format) && (cur->next != NULL) &&
                (info != NULL) && (!info->isinline)) {
                if ((cur->next->type != HTML_TEXT_NODE) &&
                    (cur->next->type != HTML_ENTITY_REF_NODE) &&
                    (cur->parent != NULL) &&
                    (cur->parent->name != NULL) &&
                    (cur->parent->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");
            }

            break;

        case XML_ATTRIBUTE_NODE:
            htmlAttrDumpOutput(buf, doc, (xmlAttrPtr) cur, encoding);
            break;

        case HTML_TEXT_NODE:
            if (cur->content == NULL)
                break;
            if (((cur->name == (const xmlChar *)xmlStringText) ||
                 (cur->name != (const xmlChar *)xmlStringTextNoenc)) &&
                ((cur->parent == NULL) ||
                 ((xmlStrcasecmp(cur->parent->name, BAD_CAST "script")) &&
                  (xmlStrcasecmp(cur->parent->name, BAD_CAST "style"))))) {
                xmlChar *buffer;

                buffer = xmlEncodeEntitiesReentrant(doc, cur->content);
                if (buffer != NULL) {
                    xmlOutputBufferWriteString(buf, (const char *)buffer);
                    xmlFree(buffer);
                }
            } else {
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
            }
            break;

        case HTML_COMMENT_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWriteString(buf, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWriteString(buf, "-->");
            }
            break;

        case HTML_PI_NODE:
            if (cur->name != NULL) {
                xmlOutputBufferWriteString(buf, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    xmlOutputBufferWriteString(buf, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWriteString(buf, ">");
            }
            break;

        case HTML_ENTITY_REF_NODE:
            xmlOutputBufferWriteString(buf, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWriteString(buf, ";");
            break;

        case HTML_PRESERVE_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
            }
            break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            /*
             * The parent should never be NULL here but we want to handle
             * corrupted documents gracefully.
             */
            if (cur->parent == NULL)
                return;
            cur = cur->parent;

            if ((cur->type == XML_HTML_DOCUMENT_NODE) ||
                (cur->type == XML_DOCUMENT_NODE)) {
                xmlOutputBufferWriteString(buf, "\n");
            } else {
                if ((format) && (cur->ns == NULL))
                    info = htmlTagLookup(cur->name);
                else
                    info = NULL;

                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->last->type != HTML_TEXT_NODE) &&
                    (cur->last->type != HTML_ENTITY_REF_NODE) &&
                    (cur->children != cur->last) &&
                    (cur->name != NULL) &&
                    (cur->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");

                xmlOutputBufferWriteString(buf, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                    xmlOutputBufferWriteString(buf, ":");
                }
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWriteString(buf, ">");

                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->next != NULL)) {
                    if ((cur->next->type != HTML_TEXT_NODE) &&
                        (cur->next->type != HTML_ENTITY_REF_NODE) &&
                        (cur->parent != NULL) &&
                        (cur->parent->name != NULL) &&
                        (cur->parent->name[0] != 'p')) /* p, pre, param */
                        xmlOutputBufferWriteString(buf, "\n");
                }
            }
        }
    }
}